

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O0

vec3 s2_to_r3(float theta,float phi)

{
  vec3 vVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  float tmp;
  float phi_local;
  float theta_local;
  float_t local_c;
  
  fVar2 = radians(theta);
  fVar3 = radians(phi);
  dVar4 = std::sin((double)(ulong)(uint)fVar2);
  dVar5 = std::cos((double)(ulong)(uint)fVar3);
  dVar6 = std::sin((double)(ulong)(uint)fVar3);
  dVar7 = std::cos((double)(ulong)(uint)fVar2);
  dja::vec3::vec3((vec3 *)&phi_local,SUB84(dVar4,0) * SUB84(dVar5,0),SUB84(dVar4,0) * SUB84(dVar6,0)
                  ,SUB84(dVar7,0));
  vVar1.z = local_c;
  vVar1.x = phi_local;
  vVar1.y = theta_local;
  return vVar1;
}

Assistant:

dja::vec3 s2_to_r3(float theta, float phi)
{
    theta = radians(theta);
    phi = radians(phi);
    float tmp = sin(theta);
    return dja::vec3(tmp * cos(phi), tmp * sin(phi), cos(theta));
}